

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

bool __thiscall GlobOpt::DoObjTypeSpec(GlobOpt *this,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  JITTimeProfileInfo *this_00;
  undefined4 *puVar5;
  
  bVar2 = Func::DoFastPaths(this->func);
  if (bVar2) {
    uVar3 = Func::GetSourceContextId(this->func);
    uVar4 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,ObjTypeSpecPhase,uVar3,uVar4);
    if (bVar2) {
      return true;
    }
    uVar3 = Func::GetSourceContextId(this->func);
    uVar4 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ObjTypeSpecPhase,uVar3,uVar4);
    if (!bVar2) {
      bVar2 = Func::IsLoopBody(this->func);
      if ((bVar2) && (bVar2 = Func::HasProfileInfo(this->func), bVar2)) {
        this_00 = Func::GetReadOnlyProfileInfo(this->func);
        bVar2 = JITTimeProfileInfo::IsObjTypeSpecDisabledInJitLoopBody(this_00);
        if (bVar2) {
          return false;
        }
      }
      bVar2 = ImplicitCallFlagsAllowOpts(this->func);
      if (bVar2) {
        if (loop == (Loop *)0x0) {
          return true;
        }
        bVar2 = Loop::CanDoFieldCopyProp(loop);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x52,"(loop == nullptr || loop->CanDoFieldCopyProp())",
                             "loop == nullptr || loop->CanDoFieldCopyProp()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          return true;
        }
        return true;
      }
      if (loop != (Loop *)0x0) {
        bVar2 = Loop::CanDoFieldCopyProp(loop);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoObjTypeSpec(Loop *loop) const
{
    if (!this->func->DoFastPaths())
    {
        return false;
    }
    if (PHASE_FORCE(Js::ObjTypeSpecPhase, this->func))
    {
        return true;
    }
    if (PHASE_OFF(Js::ObjTypeSpecPhase, this->func))
    {
        return false;
    }
    if (this->func->IsLoopBody() && this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsObjTypeSpecDisabledInJitLoopBody())
    {
        return false;
    }
    if (this->ImplicitCallFlagsAllowOpts(this->func))
    {
        Assert(loop == nullptr || loop->CanDoFieldCopyProp());
        return true;
    }
    return loop != nullptr && loop->CanDoFieldCopyProp();
}